

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_gej_zinv(secp256k1_ge *r,secp256k1_gej *a,secp256k1_fe *zi)

{
  undefined1 local_70 [8];
  secp256k1_fe zi3;
  secp256k1_fe zi2;
  secp256k1_fe *zi_local;
  secp256k1_gej *a_local;
  secp256k1_ge *r_local;
  
  secp256k1_fe_sqr((secp256k1_fe *)(zi3.n + 4),zi);
  secp256k1_fe_mul((secp256k1_fe *)local_70,(secp256k1_fe *)(zi3.n + 4),zi);
  secp256k1_fe_mul(&r->x,&a->x,(secp256k1_fe *)(zi3.n + 4));
  secp256k1_fe_mul(&r->y,&a->y,(secp256k1_fe *)local_70);
  r->infinity = a->infinity;
  return;
}

Assistant:

static void secp256k1_ge_set_gej_zinv(secp256k1_ge *r, const secp256k1_gej *a, const secp256k1_fe *zi) {
    secp256k1_fe zi2;
    secp256k1_fe zi3;
    secp256k1_fe_sqr(&zi2, zi);
    secp256k1_fe_mul(&zi3, &zi2, zi);
    secp256k1_fe_mul(&r->x, &a->x, &zi2);
    secp256k1_fe_mul(&r->y, &a->y, &zi3);
    r->infinity = a->infinity;
}